

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RendererParallelTests::RowsAreProcessedInInterlacedOrderInDedicatedThreads
          (RendererParallelTests *this)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  undefined8 *puVar3;
  parallel *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  void *pvVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  undefined8 *puVar10;
  FailedAssertion *pFVar11;
  long lVar12;
  rendition_adapter adapter;
  renderer_parallel r3;
  renderer_parallel r2;
  thread_mapping_blender<unsigned_short,_unsigned_char> blender;
  thread_mapping mapping;
  mask_full<8UL> mask;
  renderer_parallel r1;
  cell cells6 [2];
  cell cells5 [2];
  cell cells4 [2];
  cell cells3 [2];
  cell cells2 [2];
  cell cells1 [2];
  mutex mtx;
  scanline_cells cells [6];
  LocationInfo local_340;
  bitmap<unsigned_short,_0UL,_0UL> *local_318;
  undefined1 local_308 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  string *local_2e8;
  undefined4 local_2e0;
  bitmap<unsigned_short,_0UL,_0UL> local_2d8;
  string local_2b8;
  string *local_298;
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  undefined1 *local_270;
  undefined4 local_268;
  undefined **local_260;
  string local_258;
  void **local_238;
  mutex *local_230;
  void *local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  mask<8ul> local_210 [16];
  void *local_200;
  undefined8 *local_1e8;
  parallel local_1e0;
  undefined4 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [8];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined1 local_180 [8];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined1 local_160 [8];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined1 local_140 [8];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined1 local_120 [8];
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined1 local_100 [104];
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_98;
  undefined8 *local_88;
  undefined1 *local_80;
  undefined8 *local_78;
  undefined1 *local_70;
  undefined8 *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  undefined1 *local_40;
  
  local_98.second = (cell *)local_100;
  local_118._0_8_ = 0;
  local_118._8_8_ = 0x300000010;
  local_108 = 0xfffffff000000000;
  local_80 = local_120;
  local_138 = 1;
  uStack_130 = 0x400000010;
  local_128 = 0xfffffff000000000;
  local_70 = local_140;
  local_158 = 2;
  uStack_150 = 0x500000010;
  local_148 = 0xfffffff000000000;
  local_60 = local_160;
  local_178 = 1;
  uStack_170 = 0x400000010;
  local_168 = 0xfffffff000000000;
  local_50 = local_180;
  local_188 = 0xfffffff000000000;
  local_198 = 0;
  uStack_190 = 0x300000010;
  local_40 = local_1a0;
  local_1a8 = 0xfffffff000000000;
  local_1b8 = 1;
  uStack_1b0 = 0x400000010;
  local_98.first = (cell *)local_118;
  local_88 = &local_138;
  local_78 = &local_158;
  local_68 = &local_178;
  local_58 = &local_198;
  local_48 = &local_1b8;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,6>
            (local_210,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [6])
             &local_98,0);
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x3c);
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start + 0x1e;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[8] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[9] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[3] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[4] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[5] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[6] = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start[7] = 0;
  local_2d8._width = 5;
  local_2d8._height = 6;
  local_228 = (void *)0x0;
  uStack_220 = 0;
  local_218 = 0;
  local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  mutex::mutex((mutex *)(local_100 + 4));
  local_238 = &local_228;
  local_230 = (mutex *)(local_100 + 4);
  puVar10 = (undefined8 *)operator_new__(0x28);
  *puVar10 = 2;
  local_1e8 = puVar10 + 1;
  puVar10[1] = 0;
  *(undefined4 *)(puVar10 + 2) = 0;
  puVar10[3] = 0;
  *(undefined4 *)(puVar10 + 4) = 0;
  parallel::parallel(&local_1e0,2);
  local_280._M_allocated_capacity = (size_type)&local_1e8;
  local_1c0 = 2;
  local_340.filename._M_dataplus._M_p = (pointer)&local_238;
  local_290._8_8_ = &local_340;
  local_340.filename._M_string_length = 0;
  local_340.filename.field_2._M_allocated_capacity = 0;
  local_318 = &local_2d8;
  local_340.filename.field_2._8_4_ = local_2d8._width;
  local_340.filename.field_2._12_4_ = local_2d8._height;
  local_260 = &PTR_operator___001c2ea8;
  local_290._0_8_ = &PTR_operator___001c2ea8;
  local_270 = local_308;
  local_280._8_8_ = local_210;
  parallel::call(&local_1e0,(kernel_function *)local_290);
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,0);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,2);
  local_308._0_8_ = &local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,(string *)local_308,0x97);
  if (iVar8 != iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_290._0_8_ = &local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_290,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._0_8_ != &local_2f8) {
    operator_delete((void *)local_308._0_8_);
  }
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,0);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,4);
  local_308._0_8_ = &local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,(string *)local_308,0x98);
  if (iVar8 != iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_290._0_8_ = &local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_290,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._0_8_ != &local_2f8) {
    operator_delete((void *)local_308._0_8_);
  }
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,0);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,1);
  local_308._0_8_ = &local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,(string *)local_308,0x9a);
  if (iVar8 == iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_290._0_8_ = &local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Values are equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_290,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._0_8_ != &local_2f8) {
    operator_delete((void *)local_308._0_8_);
  }
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,1);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,3);
  local_308._0_8_ = &local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,(string *)local_308,0x9b);
  if (iVar8 != iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_290._0_8_ = &local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_290,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._0_8_ != &local_2f8) {
    operator_delete((void *)local_308._0_8_);
  }
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,1);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,5);
  local_308._0_8_ = &local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,(string *)local_308,0x9c);
  if (iVar8 != iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_290._0_8_ = &local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_290,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._0_8_ != &local_2f8) {
    operator_delete((void *)local_308._0_8_);
  }
  puVar10 = (undefined8 *)operator_new__(0x38);
  *puVar10 = 3;
  lVar12 = 0x10;
  do {
    *(undefined8 *)((long)puVar10 + lVar12 + -8) = 0;
    *(undefined4 *)((long)puVar10 + lVar12) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x40);
  local_290._0_8_ = puVar10 + 1;
  parallel::parallel((parallel *)(local_290 + 8),3);
  local_268 = 3;
  local_340.filename._M_dataplus._M_p = (pointer)&local_238;
  local_340.filename._M_string_length = 0;
  local_340.filename.field_2._M_allocated_capacity = 0;
  local_340.filename.field_2._8_4_ = local_2d8._width;
  local_340.filename.field_2._12_4_ = local_2d8._height;
  local_308._0_8_ = local_260;
  local_2f8._8_8_ = local_210;
  local_2e8 = &local_2b8;
  local_318 = &local_2d8;
  local_308._8_8_ = &local_340;
  local_2f8._M_allocated_capacity = (size_type)(kernel_function *)local_290;
  parallel::call((parallel *)(local_290 + 8),(kernel_function *)local_308);
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,0);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,3);
  paVar4 = &local_2b8.field_2;
  local_2b8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,&local_2b8,0xa3);
  if (iVar8 != iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_308._0_8_ = &local_2f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_308,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,0);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,1);
  local_2b8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,&local_2b8,0xa5);
  if (iVar8 == iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_308._0_8_ = &local_2f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Values are equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_308,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,1);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,4);
  local_2b8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,&local_2b8,0xa6);
  if (iVar8 != iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_308._0_8_ = &local_2f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_308,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,0);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,2);
  local_2b8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,&local_2b8,0xa8);
  if (iVar8 == iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_308._0_8_ = &local_2f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Values are equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_308,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,1);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,2);
  local_2b8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,&local_2b8,0xa9);
  if (iVar8 == iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_308._0_8_ = &local_2f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Values are equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_308,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,2);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,5);
  local_2b8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,&local_2b8,0xaa);
  if (iVar8 != iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_308._0_8_ = &local_2f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar11,(string *)local_308,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  puVar10 = (undefined8 *)operator_new__(0x58);
  *puVar10 = 5;
  lVar12 = 0x10;
  do {
    *(undefined8 *)((long)puVar10 + lVar12 + -8) = 0;
    *(undefined4 *)((long)puVar10 + lVar12) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x60);
  local_308._0_8_ = puVar10 + 1;
  this_00 = (parallel *)(local_308 + 8);
  parallel::parallel(this_00,5);
  local_2e0 = 5;
  local_340.filename._M_dataplus._M_p = (pointer)&local_238;
  local_340.filename._M_string_length = 0;
  local_340.filename.field_2._M_allocated_capacity = 0;
  local_340.filename.field_2._8_4_ = local_2d8._width;
  local_340.filename.field_2._12_4_ = local_2d8._height;
  local_2b8._M_dataplus._M_p = (pointer)local_260;
  local_2b8.field_2._8_8_ = local_210;
  local_298 = &local_258;
  local_318 = &local_2d8;
  local_2b8._M_string_length = (size_type)&local_340;
  local_2b8.field_2._M_allocated_capacity = (size_type)(kernel_function *)local_308;
  parallel::call(this_00,(kernel_function *)&local_2b8);
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,0);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,5);
  paVar5 = &local_258.field_2;
  local_258._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,&local_258,0xb1);
  if (iVar8 != iVar9) {
    pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_2b8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar11,&local_2b8,&local_340);
    __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
    operator_delete(local_340.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar5) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  iVar8 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,0);
  iVar9 = (anonymous_namespace)::
          get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                    (&local_2d8,1);
  local_258._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_340,&local_258,0xb2);
  if (iVar8 != iVar9) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340.filename._M_dataplus._M_p != &local_340.filename.field_2) {
      operator_delete(local_340.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar5) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    uVar7 = local_308._0_8_;
    if ((pointer)local_308._0_8_ != (pointer)0x0) {
      pcVar1 = (pointer)(local_308._0_8_ + -8);
      if (*(long *)(local_308._0_8_ + -8) != 0) {
        lVar12 = *(long *)(local_308._0_8_ + -8) << 4;
        do {
          if (*(void **)(uVar7 + lVar12 + -0x10) != (void *)0x0) {
            operator_delete__(*(void **)(uVar7 + lVar12 + -0x10));
          }
          lVar12 = lVar12 + -0x10;
        } while (lVar12 != 0);
      }
      operator_delete__(pcVar1);
    }
    parallel::~parallel(this_00);
    uVar7 = local_290._0_8_;
    if ((_func_int **)local_290._0_8_ != (_func_int **)0x0) {
      pp_Var2 = (_func_int **)(local_290._0_8_ + -8);
      if (*(_func_int **)(local_290._0_8_ + -8) != (_func_int *)0x0) {
        lVar12 = (long)*(_func_int **)(local_290._0_8_ + -8) << 4;
        do {
          if (*(void **)(uVar7 + lVar12 + -0x10) != (void *)0x0) {
            operator_delete__(*(void **)(uVar7 + lVar12 + -0x10));
          }
          lVar12 = lVar12 + -0x10;
        } while (lVar12 != 0);
      }
      operator_delete__(pp_Var2);
    }
    parallel::~parallel((parallel *)(local_290 + 8));
    puVar10 = local_1e8;
    if (local_1e8 != (undefined8 *)0x0) {
      puVar3 = local_1e8 + -1;
      if (local_1e8[-1] != 0) {
        lVar12 = local_1e8[-1] << 4;
        do {
          pvVar6 = *(void **)((long)puVar10 + lVar12 + -0x10);
          if (pvVar6 != (void *)0x0) {
            operator_delete__(pvVar6);
          }
          lVar12 = lVar12 + -0x10;
        } while (lVar12 != 0);
      }
      operator_delete__(puVar3);
    }
    parallel::~parallel(&local_1e0);
    mutex::~mutex((mutex *)(local_100 + 4));
    if (local_228 != (void *)0x0) {
      operator_delete(local_228);
    }
    if (local_2d8.data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d8.data.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_200 != (void *)0x0) {
      operator_delete(local_200);
    }
    return;
  }
  pFVar11 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_2b8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Values are equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar11,&local_2b8,&local_340);
  __cxa_throw(pFVar11,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( RowsAreProcessedInInterlacedOrderInDedicatedThreads )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x10 }, { 3, 0, -0x10 }, };
				const mocks::cell cells2[] = { { 1, 0, 0x10 }, { 4, 0, -0x10 }, };
				const mocks::cell cells3[] = { { 2, 0, 0x10 }, { 5, 0, -0x10 }, };
				const mocks::cell cells4[] = { { 1, 0, 0x10 }, { 4, 0, -0x10 }, };
				const mocks::cell cells5[] = { { 0, 0, 0x10 }, { 3, 0, -0x10 }, };
				const mocks::cell cells6[] = { { 1, 0, 0x10 }, { 4, 0, -0x10 }, };
				mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
					make_pair(begin(cells4), end(cells4)),
					make_pair(begin(cells5), end(cells5)),
					make_pair(begin(cells6), end(cells6)),
				};
				mocks::mask_full<8> mask(cells, 0);
				mocks::bitmap<uint16_t> bitmap(5, 6);
				thread_mapping mapping;
				mutex mtx;
				mocks::thread_mapping_blender<uint16_t, uint8_t> blender(mapping, mtx);

				// ACT
				renderer_parallel r1(2);
				r1(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 2));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 4));

				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 1));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 3));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 5));

				// ACT
				renderer_parallel r2(3);
				r2(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 3));

				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 1));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 4));

				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 2));
				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 2));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 2), get_scanline_thread<uint8_t>(bitmap, 5));

				// ACT
				renderer_parallel r3(5);
				r3(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 5));
				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 1));
			}